

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O2

int Sbl_ManCriticalFanin(Sbl_Man_t *p,int iLut,Vec_Int_t *vFanins)

{
  int iVar1;
  int i;
  int iVar2;
  int i_00;
  
  iVar1 = Vec_IntEntry(p->vArrs,iLut);
  i_00 = 0;
  do {
    if (vFanins->nSize <= i_00) {
      return -1;
    }
    i = Vec_IntEntry(vFanins,i_00);
    iVar2 = Vec_IntEntry(p->vArrs,i);
    i_00 = i_00 + 1;
  } while (iVar2 + 1 != iVar1);
  return i;
}

Assistant:

int Sbl_ManCriticalFanin( Sbl_Man_t * p, int iLut, Vec_Int_t * vFanins )
{
    int k, iFan, Delay = Vec_IntEntry(p->vArrs, iLut);
    Vec_IntForEachEntry( vFanins, iFan, k )
        if ( Vec_IntEntry(p->vArrs, iFan) + 1 == Delay )
            return iFan;
    return -1;
}